

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_manager.cpp
# Opt level: O2

unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> __thiscall
duckdb::LogManager::CreateLogger
          (LogManager *this,LoggingContext context,bool thread_safe,bool mutable_settings)

{
  char in_CL;
  undefined7 in_register_00000031;
  LogManager *this_00;
  element_type *local_60;
  unique_lock<std::mutex> local_58;
  RegisteredLoggingContext local_48;
  
  this_00 = (LogManager *)CONCAT71(in_register_00000031,thread_safe);
  ::std::unique_lock<std::mutex>::unique_lock(&local_58,&this_00->lock);
  RegisterLoggingContextInternal(&local_48,this_00,&context);
  if (in_CL == '\0') {
    if ((this_00->config).enabled == false) {
      make_uniq<duckdb::NopLogger,duckdb::LogManager&>((duckdb *)&local_60,this_00);
    }
    else {
      make_uniq<duckdb::ThreadSafeLogger,duckdb::LogConfig&,duckdb::RegisteredLoggingContext&,duckdb::LogManager&>
                ((duckdb *)&local_60,&this_00->config,&local_48,this_00);
    }
  }
  else {
    make_uniq<duckdb::MutableLogger,duckdb::LogConfig&,duckdb::RegisteredLoggingContext&,duckdb::LogManager&>
              ((duckdb *)&local_60,&this_00->config,&local_48,this_00);
  }
  (this->super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
  super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
  return (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)
         (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)this;
}

Assistant:

unique_ptr<Logger> LogManager::CreateLogger(LoggingContext context, bool thread_safe, bool mutable_settings) {
	unique_lock<mutex> lck(lock);

	auto registered_logging_context = RegisterLoggingContextInternal(context);

	if (mutable_settings) {
		return make_uniq<MutableLogger>(config, registered_logging_context, *this);
	}
	if (!config.enabled) {
		return make_uniq<NopLogger>(*this);
	}
	if (!thread_safe) {
		// TODO: implement ThreadLocalLogger and return it here
	}
	return make_uniq<ThreadSafeLogger>(config, registered_logging_context, *this);
}